

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

void __thiscall QTzTimeZonePrivate::QTzTimeZonePrivate(QTzTimeZonePrivate *this)

{
  long lVar1;
  QTzTimeZonePrivate *in_RDI;
  long in_FS_OFFSET;
  QByteArray *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  staticSystemTimeZoneId();
  QTzTimeZonePrivate(in_RDI,in_stack_ffffffffffffffd0);
  QByteArray::~QByteArray((QByteArray *)0x748b5f);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTzTimeZonePrivate::QTzTimeZonePrivate()
    : QTzTimeZonePrivate(staticSystemTimeZoneId())
{
}